

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[31],capnp::Text::Reader>
          (String *__return_storage_ptr__,kj *this,char (*params) [31],Reader *params_1)

{
  char (*value) [31];
  Reader *value_00;
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  NoInfer<capnp::Text::Reader> *local_20;
  Reader *params_local_1;
  char (*params_local) [31];
  
  local_20 = (NoInfer<capnp::Text::Reader> *)params;
  params_local_1 = (Reader *)this;
  params_local = (char (*) [31])__return_storage_ptr__;
  value = ::const((char (*) [31])this);
  local_30 = toCharSequence<char_const(&)[31]>(value);
  value_00 = fwd<capnp::Text::Reader>(local_20);
  local_40 = toCharSequence<capnp::Text::Reader>(value_00);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_30,&local_40,(ArrayPtr<const_char> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}